

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O2

ssize_t __thiscall
anon_unknown.dwarf_2631452::File::write(File *this,int __fd,void *__buf,size_t __n)

{
  void *pvVar1;
  undefined4 in_register_00000034;
  unique_lock<std::mutex> lock;
  
  std::unique_lock<std::mutex>::unique_lock(&lock,&this->writeMutex);
  pvVar1 = (void *)fwrite((void *)CONCAT44(in_register_00000034,__fd),1,(size_t)__buf,
                          (FILE *)this->f);
  if (pvVar1 == __buf) {
    fflush((FILE *)this->f);
  }
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  return CONCAT71((int7)((ulong)__buf >> 8),pvVar1 == __buf) & 0xffffffff;
}

Assistant:

bool write(const void* buffer, size_t n) override {
    std::unique_lock<std::mutex> lock(writeMutex);
    if (fwrite(buffer, 1, n, f) == n) {
      fflush(f);
      return true;
    }
    return false;
  }